

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O0

bool __thiscall QHstsStore::serializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  Status SVar1;
  longlong lVar2;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  QByteArray serializedData;
  QDataStream streamer;
  OpenModeFlag in_stack_ffffffffffffff3c;
  undefined1 i;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QHstsPolicy *in_stack_ffffffffffffff48;
  size_t *str;
  QVariant *local_80;
  QDateTime local_70 [12];
  uint local_64;
  QByteArray local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_60.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_60.d.size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x28cab3);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c
            );
  i = (undefined1)(in_stack_ffffffffffffff3c >> 0x18);
  QDataStream::QDataStream((QDataStream *)&local_48,&local_60,(QFlags_conflict *)(ulong)local_64);
  QHstsPolicy::expiry(in_stack_ffffffffffffff48);
  lVar2 = QDateTime::toMSecsSinceEpoch();
  QDataStream::operator<<((QDataStream *)&local_48,lVar2);
  QDateTime::~QDateTime(local_70);
  QHstsPolicy::includesSubDomains((QHstsPolicy *)0x28cb51);
  QDataStream::operator<<<bool,_true>
            ((QDataStream *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),(bool)i);
  SVar1 = QDataStream::status((QDataStream *)&local_48);
  if (SVar1 == Ok) {
    str = &in_RDI[1].m_size;
    QAnyStringView::QAnyStringView(in_RDI,(QString *)str);
    QVariant::QVariant(&local_28,&local_60);
    QSettings::setValue((QAnyStringView *)str,local_80);
    QVariant::~QVariant(&local_28);
  }
  QDataStream::~QDataStream((QDataStream *)&local_48);
  QByteArray::~QByteArray((QByteArray *)0x28cc01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return SVar1 == Ok;
}

Assistant:

bool QHstsStore::serializePolicy(const QString &key, const QHstsPolicy &policy)
{
    Q_ASSERT(store.isWritable());

    QByteArray serializedData;
    QDataStream streamer(&serializedData, QIODevice::WriteOnly);
    streamer << policy.expiry().toMSecsSinceEpoch();
    streamer << policy.includesSubDomains();

    if (streamer.status() != QDataStream::Ok)
        return false;

    store.setValue(key, serializedData);
    return true;
}